

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O1

void ymf278b_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  YMF278BChip *chip;
  
  uVar1 = *(uint *)((long)info + 0x568);
  if (uVar1 < offset) {
    return;
  }
  __n = (ulong)(uVar1 - offset);
  if (length + offset <= uVar1) {
    __n = (ulong)length;
  }
  memcpy((void *)((ulong)offset + *(long *)((long)info + 0x570)),data,__n);
  return;
}

Assistant:

static void ymf278b_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	YMF278BChip *chip = (YMF278BChip *)info;
	
	if (offset > chip->ROMSize)
		return;
	if (offset + length > chip->ROMSize)
		length = chip->ROMSize - offset;
	
	memcpy(chip->rom + offset, data, length);
	
	return;
}